

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

bool __thiscall DepthShader::fragment(DepthShader *this,Model *model,vec3f bar,TGAColor *color)

{
  char cVar1;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  undefined1 auVar7 [16];
  undefined6 uVar8;
  undefined8 uVar9;
  unkbyte10 Var10;
  undefined1 auVar11 [12];
  undefined1 auVar12 [14];
  short sVar13;
  undefined4 uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  undefined1 in_XMM0_Be;
  char cVar20;
  undefined1 in_XMM0_Bf;
  undefined1 uVar21;
  undefined1 in_XMM0_Bg;
  char cVar22;
  undefined1 in_XMM0_Bh;
  undefined1 uVar23;
  undefined1 in_XMM0_Bi;
  char cVar24;
  undefined1 in_XMM0_Bj;
  undefined1 in_XMM0_Bk;
  char cVar25;
  undefined1 in_XMM0_Bl;
  undefined1 in_XMM0_Bm;
  undefined1 in_XMM0_Bn;
  undefined1 in_XMM0_Bo;
  undefined1 in_XMM0_Bp;
  double dVar26;
  undefined8 local_38;
  undefined1 uStack_30;
  undefined1 uStack_2f;
  undefined1 uStack_2e;
  undefined1 uStack_2d;
  undefined1 uStack_2c;
  undefined1 uStack_2b;
  undefined1 uStack_2a;
  undefined1 uStack_29;
  double local_28;
  char cVar2;
  
  uVar16 = CONCAT13(in_XMM0_Bh,CONCAT12(in_XMM0_Bg,CONCAT11(in_XMM0_Bf,in_XMM0_Be))) ^
           CONCAT13(in_XMM0_Bh,CONCAT12(in_XMM0_Bg,CONCAT11(in_XMM0_Bf,in_XMM0_Be)));
  local_38._4_1_ = (undefined1)uVar16;
  local_38._5_1_ = (undefined1)(uVar16 >> 8);
  local_38._6_1_ = (undefined1)(uVar16 >> 0x10);
  local_38._7_1_ = (undefined1)(uVar16 >> 0x18);
  uVar16 = CONCAT13(in_XMM0_Bl,CONCAT12(in_XMM0_Bk,CONCAT11(in_XMM0_Bj,in_XMM0_Bi))) ^
           CONCAT13(in_XMM0_Bl,CONCAT12(in_XMM0_Bk,CONCAT11(in_XMM0_Bj,in_XMM0_Bi)));
  uStack_30 = (undefined1)uVar16;
  uStack_2f = (undefined1)(uVar16 >> 8);
  uStack_2e = (undefined1)(uVar16 >> 0x10);
  uStack_2d = (undefined1)(uVar16 >> 0x18);
  uVar16 = CONCAT13(in_XMM0_Bp,CONCAT12(in_XMM0_Bo,CONCAT11(in_XMM0_Bn,in_XMM0_Bm))) ^
           CONCAT13(in_XMM0_Bp,CONCAT12(in_XMM0_Bo,CONCAT11(in_XMM0_Bn,in_XMM0_Bm)));
  uStack_2c = (undefined1)uVar16;
  uStack_2b = (undefined1)(uVar16 >> 8);
  uStack_2a = (undefined1)(uVar16 >> 0x10);
  uStack_29 = (undefined1)(uVar16 >> 0x18);
  local_38._0_1_ = 0;
  local_38._1_1_ = 0;
  local_38._2_1_ = 0;
  local_38._3_1_ = 0;
  local_28 = 0.0;
  lVar19 = 0;
  do {
    dVar26 = dot<3ul,double>((vec<3UL,_double> *)((long)&(this->varying_tri).rows[2].x + lVar19),
                             &bar);
    lVar18 = 0;
    if (lVar19 != -0x30) {
      lVar18 = (ulong)(lVar19 != -0x18) * 8 + 8;
    }
    *(double *)((long)&local_38 + lVar18) = dVar26;
    lVar19 = lVar19 + -0x18;
  } while (lVar19 != -0x48);
  dVar26 = 1.0;
  if (local_28 / 500.0 <= 1.0) {
    dVar26 = local_28 / 500.0;
  }
  if (dVar26 <= 0.0) {
    dVar26 = 0.0;
  }
  iVar15 = (int)(dVar26 * 255.0);
  iVar17 = (int)(dVar26 * 255.0);
  cVar20 = (char)iVar17;
  uVar21 = (undefined1)((uint)iVar17 >> 8);
  cVar22 = (char)((uint)iVar17 >> 0x10);
  uVar23 = (undefined1)((uint)iVar17 >> 0x18);
  cVar24 = (char)iVar15;
  cVar25 = (char)((uint)iVar15 >> 0x10);
  uVar8 = CONCAT15(uVar21,CONCAT14(cVar20,iVar15));
  uVar9 = CONCAT17(uVar23,CONCAT16(cVar22,uVar8));
  Var10 = CONCAT19((char)((uint)iVar15 >> 8),CONCAT18(cVar24,uVar9));
  auVar11[10] = cVar25;
  auVar11._0_10_ = Var10;
  auVar11[0xb] = (char)((uint)iVar15 >> 0x18);
  auVar12[0xc] = cVar20;
  auVar12._0_12_ = auVar11;
  auVar12[0xd] = uVar21;
  auVar7[0xe] = cVar22;
  auVar7._0_14_ = auVar12;
  auVar7[0xf] = uVar23;
  sVar3 = (short)iVar15;
  cVar1 = (0 < sVar3) * (sVar3 < 0x100) * cVar24 - (0xff < sVar3);
  sVar3 = (short)((uint)iVar15 >> 0x10);
  sVar4 = (short)((uint6)uVar8 >> 0x20);
  cVar2 = (0 < sVar4) * (sVar4 < 0x100) * cVar20 - (0xff < sVar4);
  sVar4 = (short)((ulong)uVar9 >> 0x30);
  sVar5 = (short)((unkuint10)Var10 >> 0x40);
  cVar24 = (0 < sVar5) * (sVar5 < 0x100) * cVar24 - (0xff < sVar5);
  sVar5 = auVar11._10_2_;
  sVar6 = auVar12._12_2_;
  cVar20 = (0 < sVar6) * (sVar6 < 0x100) * cVar20 - (0xff < sVar6);
  sVar6 = auVar7._14_2_;
  sVar13 = CONCAT11((0 < sVar3) * (sVar3 < 0x100) * cVar25 - (0xff < sVar3),cVar1);
  uVar14 = CONCAT13((0 < sVar4) * (sVar4 < 0x100) * cVar22 - (0xff < sVar4),CONCAT12(cVar2,sVar13));
  uVar8 = CONCAT15((0 < sVar5) * (sVar5 < 0x100) * cVar25 - (0xff < sVar5),CONCAT14(cVar24,uVar14));
  sVar3 = (short)((uint)uVar14 >> 0x10);
  sVar4 = (short)((uint6)uVar8 >> 0x20);
  sVar5 = (short)(CONCAT17((0 < sVar6) * (sVar6 < 0x100) * cVar22 - (0xff < sVar6),
                           CONCAT16(cVar20,uVar8)) >> 0x30);
  *(uint *)color->bgra =
       CONCAT13((0 < sVar5) * (sVar5 < 0x100) * cVar20 - (0xff < sVar5),
                CONCAT12((0 < sVar4) * (sVar4 < 0x100) * cVar24 - (0xff < sVar4),
                         CONCAT11((0 < sVar3) * (sVar3 < 0x100) * cVar2 - (0xff < sVar3),
                                  (0 < sVar13) * (sVar13 < 0x100) * cVar1 - (0xff < sVar13))));
  color->bytespp = '\x04';
  return false;
}

Assistant:

virtual bool fragment(Model& model, vec3f bar, TGAColor& color)
    {
        vec3f p = varying_tri * bar;
        color = TGAColor(255, 255, 255) * (p.z / 500.f);
        return false;
    }